

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O1

void anon_unknown.dwarf_3050b3::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  ulong *__s;
  ulong *__s_00;
  float fVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  _Alloc_hider _Var7;
  _Alloc_hider _Var8;
  char cVar9;
  _Rb_tree_color _Var10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ostream *poVar19;
  long *plVar20;
  int *piVar21;
  undefined4 *puVar22;
  char *pcVar23;
  half *phVar24;
  Header *pHVar25;
  long lVar26;
  void *pvVar27;
  void *pvVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  float *pfVar31;
  float *pfVar32;
  ChannelList *pCVar33;
  ChannelList *pCVar34;
  ulong uVar35;
  ulong *puVar36;
  long lVar37;
  ulong *puVar38;
  ulong *puVar39;
  undefined4 uVar40;
  uint uVar41;
  undefined4 in_register_0000000c;
  int iVar42;
  void *pvVar43;
  ulong uVar44;
  void *pvVar45;
  ulong uVar46;
  undefined4 in_register_00000084;
  ulong uVar47;
  undefined4 in_register_0000008c;
  uint uVar48;
  long lVar49;
  Array2D<Imath_3_2::half> *pAVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  Array2D<Imath_3_2::half> *pAVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  long local_280;
  long local_278;
  Array2D<Imath_3_2::half> *local_270;
  TiledInputFile in1;
  TiledInputFile in2;
  ulong local_248;
  ulong *local_240;
  FrameBuffer fb;
  ulong *local_208;
  Array2D<Imath_3_2::half> ph1;
  FrameBuffer fb2;
  Header hdr;
  TiledOutputFile out;
  string filename2;
  string filename1;
  Array<Imf_3_2::Array2D<Imath_3_2::half>_> levels2;
  Array<Imf_3_2::Array2D<Imath_3_2::half>_> levels1;
  
  filename1._M_dataplus._M_p = (pointer)&filename1.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename1,pcVar2,pcVar2 + tempDir->_M_string_length,
             CONCAT44(in_register_0000000c,xs),CONCAT44(in_register_00000084,ys),
             CONCAT44(in_register_0000008c,dx));
  std::__cxx11::string::append((char *)&filename1);
  filename2._M_dataplus._M_p = (pointer)&filename2.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename2,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename2);
  _Var10 = w + 0xaa;
  iVar42 = h + 0x102;
  lVar17 = (long)-h;
  lVar18 = (long)-w;
  iVar16 = 0;
  do {
    iVar6 = 0;
    do {
      _Var8._M_p = filename1._M_dataplus._M_p;
      _Var7._M_p = filename2._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 0, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", roundingMode ",0xf);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", xOffset ",10);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", yOffset ",10);
      plVar20 = (long *)std::ostream::operator<<(poVar19,h);
      std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
      std::ostream::put((char)plVar20);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var10;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar42;
      Imf_3_2::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar21 = (int *)Imf_3_2::Header::compression();
      *piVar21 = iVar16;
      puVar22 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar22 = 0;
      pcVar23 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar23,(Channel *)0x1ca1d4);
      _out = 0x3700000011;
      Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0x103;
      ph1._sizeY = 0xab;
      phVar24 = (half *)operator_new__(0x15a02);
      ph1._data = phVar24;
      fillPixels(&ph1,0xab,0x103);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)(phVar24 + lVar17 * 0xab + lVar18),2,0x156,1,1,0.0,false
                 ,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var8._M_p);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var8._M_p,&hdr,iVar11);
      Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar13 = (int)&out;
      iVar11 = Imf_3_2::TiledOutputFile::numXTiles(iVar13);
      iVar12 = Imf_3_2::TiledOutputFile::numYTiles(iVar13);
      Imf_3_2::TiledOutputFile::writeTiles(iVar13,0,iVar11 + -1,0,iVar12 + -1);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&fb,_Var8._M_p,iVar11);
      pHVar25 = (Header *)Imf_3_2::InputFile::header();
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var7._M_p,pHVar25,iVar11);
      Imf_3_2::TiledOutputFile::copyPixels((InputFile *)&out);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      Imf_3_2::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in1,_Var8._M_p,iVar11);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in2,_Var7._M_p,iVar11);
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::dataWindow();
      iVar11 = piVar21[2];
      lVar51 = (long)*piVar21;
      uVar35 = (iVar11 - lVar51) + 1;
      iVar12 = piVar21[1];
      iVar13 = piVar21[3] - iVar12;
      uVar48 = iVar13 + 1;
      lVar26 = (long)(int)uVar48 * uVar35;
      uVar44 = lVar26 * 2;
      if (lVar26 < 0) {
        uVar44 = 0xffffffffffffffff;
      }
      pvVar27 = operator_new__(uVar44);
      pvVar28 = operator_new__(uVar44);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar26 = (long)-iVar12 * uVar35;
      uVar44 = uVar35 * 2;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar27 + lVar51 * -2 + lVar26 * 2),2,uVar44,1,1,
                 0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
      Imf_3_2::Slice::Slice
                ((Slice *)&out,HALF,(char *)((long)pvVar28 + lVar51 * -2 + lVar26 * 2),2,uVar44,1,1,
                 0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&fb2,(Slice *)0x1ca1d4);
      Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
      iVar12 = Imf_3_2::TiledInputFile::numXTiles((int)&in1);
      iVar14 = Imf_3_2::TiledInputFile::numYTiles((int)&in1);
      Imf_3_2::TiledInputFile::readTiles((int)&in1,0,iVar12 + -1,0,iVar14 + -1);
      Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
      iVar12 = Imf_3_2::TiledInputFile::numXTiles((int)&in2);
      iVar14 = Imf_3_2::TiledInputFile::numYTiles((int)&in2);
      uVar40 = 0;
      Imf_3_2::TiledInputFile::readTiles((int)&in2,0,iVar12 + -1,0,iVar14 + -1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::TiledInputFile::header();
      puVar29 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar30 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar12 = -(uint)((int)*puVar30 == (int)*puVar29);
      iVar14 = -(uint)((int)((ulong)*puVar30 >> 0x20) == (int)((ulong)*puVar29 >> 0x20));
      auVar56._4_4_ = iVar12;
      auVar56._0_4_ = iVar12;
      auVar56._8_4_ = iVar14;
      auVar56._12_4_ = iVar14;
      iVar12 = movmskpd(uVar40,auVar56);
      if ((iVar12 != 3) ||
         (iVar14 = -(uint)((int)puVar30[1] == (int)puVar29[1]),
         iVar68 = -(uint)((int)((ulong)puVar30[1] >> 0x20) == (int)((ulong)puVar29[1] >> 0x20)),
         auVar57._4_4_ = iVar14, auVar57._0_4_ = iVar14, auVar57._8_4_ = iVar68,
         auVar57._12_4_ = iVar68, iVar14 = movmskpd((int)puVar30,auVar57), iVar14 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8d,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      puVar29 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar30 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar14 = -(uint)((int)*puVar30 == (int)*puVar29);
      iVar68 = -(uint)((int)((ulong)*puVar30 >> 0x20) == (int)((ulong)*puVar29 >> 0x20));
      auVar58._4_4_ = iVar14;
      auVar58._0_4_ = iVar14;
      auVar58._8_4_ = iVar68;
      auVar58._12_4_ = iVar68;
      iVar12 = movmskpd(iVar12,auVar58);
      if ((iVar12 != 3) ||
         (iVar12 = -(uint)((int)puVar30[1] == (int)puVar29[1]),
         iVar14 = -(uint)((int)((ulong)puVar30[1] >> 0x20) == (int)((ulong)puVar29[1] >> 0x20)),
         auVar59._4_4_ = iVar12, auVar59._0_4_ = iVar12, auVar59._8_4_ = iVar14,
         auVar59._12_4_ = iVar14, iVar12 = movmskpd((int)puVar30,auVar59), iVar12 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8e,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar1 = *pfVar31;
      pfVar31 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x8f,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar32 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar31 != *pfVar32) || (NAN(*pfVar31) || NAN(*pfVar32))) ||
          (pfVar31[1] != pfVar32[1])) || (NAN(pfVar31[1]) || NAN(pfVar32[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x91,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar1 = *pfVar31;
      pfVar31 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::lineOrder();
      iVar12 = *piVar21;
      piVar21 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar12 != *piVar21) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x93,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::compression();
      iVar12 = *piVar21;
      piVar21 = (int *)Imf_3_2::Header::compression();
      if (iVar12 != *piVar21) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x94,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pCVar33 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar34 = (ChannelList *)Imf_3_2::Header::channels();
      cVar9 = Imf_3_2::ChannelList::operator==(pCVar33,pCVar34);
      if (cVar9 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x95,
                      "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (-1 < iVar13) {
        uVar46 = 0;
        pvVar43 = pvVar27;
        pvVar45 = pvVar28;
        do {
          if (-1 < (int)(iVar11 - lVar51)) {
            uVar47 = 0;
            do {
              fVar1 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)((long)pvVar43 + uVar47 * 2) * 4);
              pfVar31 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)((long)pvVar45 + uVar47 * 2) * 4);
              if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
                __assert_fail("ph1[y][x] == ph2[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x99,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              uVar47 = uVar47 + 1;
            } while ((uVar35 & 0xffffffff) != uVar47);
          }
          uVar46 = uVar46 + 1;
          pvVar45 = (void *)((long)pvVar45 + uVar44);
          pvVar43 = (void *)((long)pvVar43 + uVar44);
        } while (uVar46 != uVar48);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb2);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      operator_delete__(pvVar28);
      operator_delete__(pvVar27);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var8._M_p);
      remove(_Var7._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if (ph1._data != (half *)0x0) {
        operator_delete__(ph1._data);
      }
      Imf_3_2::Header::~Header(&hdr);
      _Var8 = filename1._M_dataplus;
      _Var7 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 1, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", roundingMode ",0xf);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", xOffset ",10);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", yOffset ",10);
      plVar20 = (long *)std::ostream::operator<<(poVar19,h);
      std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
      std::ostream::put((char)plVar20);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var10;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar42;
      Imf_3_2::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar21 = (int *)Imf_3_2::Header::compression();
      *piVar21 = iVar16;
      puVar22 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar22 = 0;
      pcVar23 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar23,(Channel *)0x1ca1d4);
      _out = 0x3700000011;
      Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
      ph1._sizeX = 0;
      ph1._sizeY = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var8._M_p);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var8._M_p,&hdr,iVar11);
      iVar11 = Imf_3_2::TiledOutputFile::numLevels();
      uVar46 = (ulong)iVar11;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar46;
      uVar35 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar44 = uVar35 + 8;
      if (0xfffffffffffffff7 < uVar35) {
        uVar44 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
        uVar44 = 0xffffffffffffffff;
      }
      puVar36 = (ulong *)operator_new__(uVar44);
      *puVar36 = uVar46;
      if (iVar11 != 0) {
        memset(puVar36 + 1,0,((uVar46 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      if (ph1._sizeY != 0) {
        lVar26 = *(long *)(ph1._sizeY + -8);
        pvVar27 = (void *)(ph1._sizeY + -8);
        if (lVar26 != 0) {
          lVar51 = lVar26 * 0x18;
          do {
            pvVar28 = *(void **)((long)pvVar27 + lVar51);
            if (pvVar28 != (void *)0x0) {
              operator_delete__(pvVar28);
            }
            lVar51 = lVar51 + -0x18;
          } while (lVar51 != 0);
        }
        operator_delete__(pvVar27,lVar26 * 0x18 + 8);
      }
      lVar51 = 0;
      lVar26 = 0;
      ph1._sizeX = uVar46;
      ph1._sizeY = (long)(puVar36 + 1);
      while( true ) {
        iVar11 = Imf_3_2::TiledOutputFile::numLevels();
        if (iVar11 <= lVar26) break;
        iVar12 = (int)(TiledOutputFile *)&fb2;
        iVar11 = Imf_3_2::TiledOutputFile::levelWidth(iVar12);
        iVar12 = Imf_3_2::TiledOutputFile::levelHeight(iVar12);
        lVar52 = ph1._sizeY;
        lVar49 = (long)iVar11;
        lVar37 = iVar12 * lVar49;
        uVar35 = lVar37 * 2;
        if (lVar37 < 0) {
          uVar35 = 0xffffffffffffffff;
        }
        pvVar28 = operator_new__(uVar35);
        pvVar27 = *(void **)(lVar52 + 0x10 + lVar51);
        if (pvVar27 != (void *)0x0) {
          operator_delete__(pvVar27);
        }
        *(long *)(lVar52 + lVar51) = (long)iVar12;
        *(long *)(lVar52 + 8 + lVar51) = lVar49;
        *(void **)(lVar52 + 0x10 + lVar51) = pvVar28;
        fillPixels((Array2D<Imath_3_2::half> *)(ph1._sizeY + lVar51),iVar11,iVar12);
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_2::Slice::Slice
                  ((Slice *)&out,HALF,
                   (char *)(*(long *)(ph1._sizeY + 8 + lVar51) * lVar17 * 2 +
                            *(long *)(ph1._sizeY + 0x10 + lVar51) + lVar18 * 2),2,lVar49 * 2,1,1,0.0
                   ,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
        Imf_3_2::TiledOutputFile::setFrameBuffer(&fb2);
        iVar13 = (int)&fb2;
        iVar11 = Imf_3_2::TiledOutputFile::numXTiles(iVar13);
        iVar12 = Imf_3_2::TiledOutputFile::numYTiles(iVar13);
        Imf_3_2::TiledOutputFile::writeTiles(iVar13,0,iVar11 + -1,0,iVar12 + -1);
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)&fb);
        lVar26 = lVar26 + 1;
        lVar51 = lVar51 + 0x18;
      }
      Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&fb,_Var8._M_p,iVar11);
      pHVar25 = (Header *)Imf_3_2::InputFile::header();
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var7._M_p,pHVar25,iVar11);
      Imf_3_2::TiledOutputFile::copyPixels((InputFile *)&out);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      Imf_3_2::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in1,_Var8._M_p,iVar11);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in2,_Var7._M_p,iVar11);
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::dataWindow();
      lVar51 = (long)*piVar21;
      iVar11 = piVar21[1];
      lVar26 = lVar51;
      uVar48 = Imf_3_2::TiledInputFile::numLevels();
      uVar40 = (undefined4)lVar26;
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::Array(&levels1,(long)(int)uVar48);
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::Array(&levels2,(long)(int)uVar48);
      if (0 < (int)uVar48) {
        lVar26 = 0x10;
        uVar35 = 0;
        do {
          iVar12 = Imf_3_2::TiledInputFile::levelWidth((int)&in2);
          iVar13 = Imf_3_2::TiledInputFile::levelHeight((int)&in2);
          pAVar54 = levels1._data;
          lVar37 = (long)iVar13;
          lVar52 = (long)iVar12;
          uVar44 = lVar37 * lVar52 * 2;
          if (lVar37 * lVar52 < 0) {
            uVar44 = 0xffffffffffffffff;
          }
          pvVar28 = operator_new__(uVar44);
          pvVar27 = *(void **)((long)&pAVar54->_sizeX + lVar26);
          if (pvVar27 != (void *)0x0) {
            operator_delete__(pvVar27);
          }
          pAVar50 = levels2._data;
          *(long *)((long)pAVar54 + lVar26 + -0x10) = lVar37;
          *(long *)((long)pAVar54 + lVar26 + -8) = lVar52;
          *(void **)((long)&pAVar54->_sizeX + lVar26) = pvVar28;
          pvVar28 = operator_new__(uVar44);
          pvVar27 = *(void **)((long)&pAVar50->_sizeX + lVar26);
          if (pvVar27 != (void *)0x0) {
            operator_delete__(pvVar27);
          }
          *(long *)((long)pAVar50 + lVar26 + -0x10) = lVar37;
          *(long *)((long)pAVar50 + lVar26 + -8) = lVar52;
          *(void **)((long)&pAVar50->_sizeX + lVar26) = pvVar28;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_2::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels1._data + lVar26 + -8) * -(long)iVar11 * 2 +
                              *(long *)((long)&(levels1._data)->_sizeX + lVar26) + lVar51 * -2),2,
                     lVar52 * 2,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
          Imf_3_2::Slice::Slice
                    ((Slice *)&out,HALF,
                     (char *)(*(long *)((long)levels2._data + lVar26 + -8) * -(long)iVar11 * 2 +
                              *(long *)((long)&(levels2._data)->_sizeX + lVar26) + lVar51 * -2),2,
                     lVar52 * 2,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&fb2,(Slice *)0x1ca1d4);
          Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
          Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in2);
          iVar12 = Imf_3_2::TiledInputFile::numXTiles((int)&in1);
          iVar13 = Imf_3_2::TiledInputFile::numYTiles((int)&in1);
          Imf_3_2::TiledInputFile::readTiles((int)&in1,0,iVar12 + -1,0,iVar13 + -1);
          iVar12 = Imf_3_2::TiledInputFile::numXTiles((int)&in2);
          iVar13 = Imf_3_2::TiledInputFile::numYTiles((int)&in2);
          uVar40 = 0;
          Imf_3_2::TiledInputFile::readTiles((int)&in2,0,iVar12 + -1,0,iVar13 + -1);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&fb2);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&fb);
          uVar35 = uVar35 + 1;
          lVar26 = lVar26 + 0x18;
        } while (uVar48 != uVar35);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::TiledInputFile::header();
      puVar29 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar30 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar11 = -(uint)((int)*puVar30 == (int)*puVar29);
      iVar12 = -(uint)((int)((ulong)*puVar30 >> 0x20) == (int)((ulong)*puVar29 >> 0x20));
      auVar60._4_4_ = iVar11;
      auVar60._0_4_ = iVar11;
      auVar60._8_4_ = iVar12;
      auVar60._12_4_ = iVar12;
      iVar11 = movmskpd(uVar40,auVar60);
      if ((iVar11 != 3) ||
         (iVar12 = -(uint)((int)puVar30[1] == (int)puVar29[1]),
         iVar13 = -(uint)((int)((ulong)puVar30[1] >> 0x20) == (int)((ulong)puVar29[1] >> 0x20)),
         auVar61._4_4_ = iVar12, auVar61._0_4_ = iVar12, auVar61._8_4_ = iVar13,
         auVar61._12_4_ = iVar13, iVar12 = movmskpd((int)puVar30,auVar61), iVar12 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,300,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      puVar29 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar30 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar12 = -(uint)((int)*puVar30 == (int)*puVar29);
      iVar13 = -(uint)((int)((ulong)*puVar30 >> 0x20) == (int)((ulong)*puVar29 >> 0x20));
      auVar62._4_4_ = iVar12;
      auVar62._0_4_ = iVar12;
      auVar62._8_4_ = iVar13;
      auVar62._12_4_ = iVar13;
      iVar11 = movmskpd(iVar11,auVar62);
      if ((iVar11 != 3) ||
         (iVar11 = -(uint)((int)puVar30[1] == (int)puVar29[1]),
         iVar12 = -(uint)((int)((ulong)puVar30[1] >> 0x20) == (int)((ulong)puVar29[1] >> 0x20)),
         auVar63._4_4_ = iVar11, auVar63._0_4_ = iVar11, auVar63._8_4_ = iVar12,
         auVar63._12_4_ = iVar12, iVar11 = movmskpd((int)puVar30,auVar63), iVar11 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12d,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar1 = *pfVar31;
      pfVar31 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x12e,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar32 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar31 != *pfVar32) || (NAN(*pfVar31) || NAN(*pfVar32))) ||
          (pfVar31[1] != pfVar32[1])) || (NAN(pfVar31[1]) || NAN(pfVar32[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x130,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar1 = *pfVar31;
      pfVar31 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x131,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::lineOrder();
      iVar11 = *piVar21;
      piVar21 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar11 != *piVar21) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x132,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::compression();
      iVar11 = *piVar21;
      piVar21 = (int *)Imf_3_2::Header::compression();
      if (iVar11 != *piVar21) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x133,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pCVar33 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar34 = (ChannelList *)Imf_3_2::Header::channels();
      cVar9 = Imf_3_2::ChannelList::operator==(pCVar33,pCVar34);
      if (cVar9 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x134,
                      "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar48) {
        uVar35 = 0;
        do {
          lVar51 = 0;
          lVar26 = 0;
          while( true ) {
            iVar11 = Imf_3_2::TiledInputFile::levelHeight((int)&in1);
            if (iVar11 <= lVar26) break;
            lVar52 = 0;
            while( true ) {
              iVar11 = Imf_3_2::TiledInputFile::levelWidth((int)&in1);
              if (iVar11 <= lVar52) break;
              fVar1 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(uint16_t *)
                                        ((long)&levels2._data[uVar35]._data[lVar52]._h +
                                        levels2._data[uVar35]._sizeY * lVar51) * 4);
              pfVar31 = (float *)(_imath_half_to_float_table +
                                 (ulong)*(uint16_t *)
                                         ((long)&levels1._data[uVar35]._data[lVar52]._h +
                                         levels1._data[uVar35]._sizeY * lVar51) * 4);
              if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
                __assert_fail("(levels2[l])[y][x] == (levels1[l])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x13a,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              if ((iVar16 - 8U < 0xfffffffe) &&
                 ((pfVar31 = (float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)
                                              (*(long *)(ph1._sizeY + 8 + uVar35 * 0x18) * lVar51 +
                                               *(long *)(ph1._sizeY + 0x10 + uVar35 * 0x18) +
                                              lVar52 * 2) * 4), fVar1 != *pfVar31 ||
                  (NAN(fVar1) || NAN(*pfVar31))))) {
                __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                              ,0x13d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                             );
              }
              lVar52 = lVar52 + 1;
            }
            lVar26 = lVar26 + 1;
            lVar51 = lVar51 + 2;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar48);
      }
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array(&levels2);
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array(&levels1);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in2);
      Imf_3_2::TiledInputFile::~TiledInputFile(&in1);
      remove(_Var8._M_p);
      remove(_Var7._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      Imf_3_2::Array<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array
                ((Array<Imf_3_2::Array2D<Imath_3_2::half>_> *)&ph1);
      Imf_3_2::Header::~Header(&hdr);
      _Var8 = filename1._M_dataplus;
      _Var7 = filename2._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"levelMode 2, ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", roundingMode ",0xf);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", xOffset ",10);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,w);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,", yOffset ",10);
      plVar20 = (long *)std::ostream::operator<<(poVar19,h);
      std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
      std::ostream::put((char)plVar20);
      std::ostream::flush();
      _out = 0;
      fb2._map._M_t._M_impl._0_8_ = 0;
      fb._map._M_t._M_impl._0_4_ = w;
      fb._map._M_t._M_impl._4_4_ = h;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var10;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iVar42;
      Imf_3_2::Header::Header
                (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
      piVar21 = (int *)Imf_3_2::Header::compression();
      *piVar21 = iVar16;
      puVar22 = (undefined4 *)Imf_3_2::Header::lineOrder();
      *puVar22 = 0;
      pcVar23 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar23,(Channel *)0x1ca1d4);
      _out = 0x3700000011;
      Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
      std::ostream::flush();
      remove(_Var8._M_p);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&fb2,_Var8._M_p,&hdr,iVar11);
      iVar11 = Imf_3_2::TiledOutputFile::numYLevels();
      iVar12 = Imf_3_2::TiledOutputFile::numXLevels();
      lVar26 = (long)iVar12;
      uVar46 = iVar11 * lVar26;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar46;
      uVar35 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar44 = uVar35 + 8;
      if (0xfffffffffffffff7 < uVar35) {
        uVar44 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar44 = 0xffffffffffffffff;
      }
      puVar36 = (ulong *)operator_new__(uVar44);
      *puVar36 = uVar46;
      pAVar54 = (Array2D<Imath_3_2::half> *)(puVar36 + 1);
      if (uVar46 != 0) {
        memset(pAVar54,0,((uVar46 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      local_280 = 0;
      local_270 = pAVar54;
      while( true ) {
        iVar11 = Imf_3_2::TiledOutputFile::numYLevels();
        if (iVar11 <= local_280) break;
        lVar51 = 0;
        pAVar50 = local_270;
        while( true ) {
          iVar11 = Imf_3_2::TiledOutputFile::numXLevels();
          if (iVar11 <= lVar51) break;
          iVar11 = Imf_3_2::TiledOutputFile::levelWidth((int)&fb2);
          iVar12 = Imf_3_2::TiledOutputFile::levelHeight((int)&fb2);
          lVar37 = (long)iVar11;
          lVar52 = iVar12 * lVar37;
          uVar35 = lVar52 * 2;
          if (lVar52 < 0) {
            uVar35 = 0xffffffffffffffff;
          }
          phVar24 = (half *)operator_new__(uVar35);
          if (pAVar50->_data != (half *)0x0) {
            operator_delete__(pAVar50->_data);
          }
          pAVar50->_sizeX = (long)iVar12;
          pAVar50->_sizeY = lVar37;
          pAVar50->_data = phVar24;
          fillPixels(pAVar50,iVar11,iVar12);
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_2::Slice::Slice
                    ((Slice *)&out,HALF,(char *)(pAVar50->_data + pAVar50->_sizeY * lVar17 + lVar18)
                     ,2,lVar37 * 2,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
          Imf_3_2::TiledOutputFile::setFrameBuffer(&fb2);
          iVar13 = (int)&fb2;
          iVar11 = Imf_3_2::TiledOutputFile::numXTiles(iVar13);
          iVar12 = Imf_3_2::TiledOutputFile::numYTiles(iVar13);
          Imf_3_2::TiledOutputFile::writeTiles(iVar13,0,iVar11 + -1,0,iVar12 + -1,(int)lVar51);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&fb);
          lVar51 = lVar51 + 1;
          pAVar50 = pAVar50 + 1;
        }
        local_280 = local_280 + 1;
        local_270 = local_270 + lVar26;
      }
      Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fb2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
      std::ostream::flush();
      remove(_Var7._M_p);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&fb,_Var8._M_p,iVar11);
      pHVar25 = (Header *)Imf_3_2::InputFile::header();
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledOutputFile::TiledOutputFile(&out,_Var7._M_p,pHVar25,iVar11);
      Imf_3_2::TiledOutputFile::copyPixels((InputFile *)&out);
      Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
      Imf_3_2::InputFile::~InputFile((InputFile *)&fb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
      std::ostream::flush();
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph1,_Var8._M_p,iVar11);
      iVar11 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile(&in1,_Var7._M_p,iVar11);
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::dataWindow();
      iVar11 = *piVar21;
      iVar12 = piVar21[1];
      uVar48 = Imf_3_2::TiledInputFile::numXLevels();
      uVar15 = Imf_3_2::TiledInputFile::numYLevels();
      lVar51 = (long)(int)uVar48;
      uVar44 = (int)uVar15 * lVar51;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar44;
      uVar35 = SUB168(auVar5 * ZEXT816(0x18),0);
      uVar46 = uVar35 + 8;
      if (0xfffffffffffffff7 < uVar35) {
        uVar46 = 0xffffffffffffffff;
      }
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar46 = 0xffffffffffffffff;
      }
      puVar38 = (ulong *)operator_new__(uVar46);
      *puVar38 = uVar44;
      __s = puVar38 + 1;
      if (uVar44 != 0) {
        memset(__s,0,((uVar44 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      puVar39 = (ulong *)operator_new__(uVar46);
      __s_00 = puVar39 + 1;
      *puVar39 = uVar44;
      if (uVar44 != 0) {
        memset(__s_00,0,((uVar44 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      uVar35 = (ulong)uVar15;
      uVar41 = uVar15;
      if (0 < (int)uVar15) {
        local_208 = puVar39 + 3;
        local_240 = puVar38 + 3;
        uVar46 = 0;
        uVar44 = uVar35;
        do {
          if (0 < (int)uVar48) {
            local_278 = 0;
            uVar47 = 0;
            do {
              iVar13 = Imf_3_2::TiledInputFile::levelWidth((int)&in1);
              iVar14 = Imf_3_2::TiledInputFile::levelHeight((int)&in1);
              lVar37 = (long)iVar14;
              lVar52 = (long)iVar13;
              uVar44 = lVar37 * lVar52 * 2;
              if (lVar37 * lVar52 < 0) {
                uVar44 = 0xffffffffffffffff;
              }
              pvVar27 = operator_new__(uVar44);
              if (*(void **)((long)local_240 + local_278) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_240 + local_278));
              }
              *(long *)((long)local_240 + local_278 + -0x10) = lVar37;
              *(long *)((long)local_240 + local_278 + -8) = lVar52;
              *(void **)((long)local_240 + local_278) = pvVar27;
              pvVar27 = operator_new__(uVar44);
              if (*(void **)((long)local_208 + local_278) != (void *)0x0) {
                operator_delete__(*(void **)((long)local_208 + local_278));
              }
              *(long *)((long)local_208 + local_278 + -0x10) = lVar37;
              *(long *)((long)local_208 + local_278 + -8) = lVar52;
              *(void **)((long)local_208 + local_278) = pvVar27;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)(*(long *)((long)local_240 + local_278 + -8) * -(long)iVar12 * 2 +
                                  *(long *)((long)local_240 + local_278) + (long)iVar11 * -2),2,
                         lVar52 * 2,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
              Imf_3_2::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)(*(long *)((long)local_208 + local_278 + -8) * -(long)iVar12 * 2 +
                                  *(long *)((long)local_208 + local_278) + (long)iVar11 * -2),2,
                         lVar52 * 2,1,1,0.0,false,false);
              Imf_3_2::FrameBuffer::insert((char *)&fb2,(Slice *)0x1ca1d4);
              Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph1);
              Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in1);
              iVar13 = Imf_3_2::TiledInputFile::numXTiles((int)&ph1);
              iVar14 = Imf_3_2::TiledInputFile::numYTiles((int)&ph1);
              Imf_3_2::TiledInputFile::readTiles((int)&ph1,0,iVar13 + -1,0,iVar14 + -1,(int)uVar47);
              iVar13 = Imf_3_2::TiledInputFile::numXTiles((int)&in1);
              iVar14 = Imf_3_2::TiledInputFile::numYTiles((int)&in1);
              uVar44 = 0;
              Imf_3_2::TiledInputFile::readTiles((int)&in1,0,iVar13 + -1,0,iVar14 + -1,(int)uVar47);
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb2);
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)&fb);
              uVar47 = uVar47 + 1;
              local_278 = local_278 + 0x18;
            } while (uVar48 != uVar47);
          }
          uVar41 = (uint)uVar44;
          uVar46 = uVar46 + 1;
          local_208 = local_208 + lVar51 * 3;
          local_240 = local_240 + lVar51 * 3;
        } while (uVar46 != uVar35);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
      std::ostream::flush();
      Imf_3_2::TiledInputFile::header();
      puVar29 = (undefined8 *)Imf_3_2::Header::displayWindow();
      puVar30 = (undefined8 *)Imf_3_2::Header::displayWindow();
      iVar11 = -(uint)((int)*puVar30 == (int)*puVar29);
      iVar12 = -(uint)((int)((ulong)*puVar30 >> 0x20) == (int)((ulong)*puVar29 >> 0x20));
      auVar64._4_4_ = iVar11;
      auVar64._0_4_ = iVar11;
      auVar64._8_4_ = iVar12;
      auVar64._12_4_ = iVar12;
      iVar11 = movmskpd(uVar41,auVar64);
      if ((iVar11 != 3) ||
         (iVar12 = -(uint)((int)puVar30[1] == (int)puVar29[1]),
         iVar13 = -(uint)((int)((ulong)puVar30[1] >> 0x20) == (int)((ulong)puVar29[1] >> 0x20)),
         auVar65._4_4_ = iVar12, auVar65._0_4_ = iVar12, auVar65._8_4_ = iVar13,
         auVar65._12_4_ = iVar13, iVar12 = movmskpd((int)puVar30,auVar65), iVar12 != 3)) {
        __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1da,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      puVar29 = (undefined8 *)Imf_3_2::Header::dataWindow();
      puVar30 = (undefined8 *)Imf_3_2::Header::dataWindow();
      iVar12 = -(uint)((int)*puVar30 == (int)*puVar29);
      iVar13 = -(uint)((int)((ulong)*puVar30 >> 0x20) == (int)((ulong)*puVar29 >> 0x20));
      auVar66._4_4_ = iVar12;
      auVar66._0_4_ = iVar12;
      auVar66._8_4_ = iVar13;
      auVar66._12_4_ = iVar13;
      iVar11 = movmskpd(iVar11,auVar66);
      if ((iVar11 != 3) ||
         (iVar11 = -(uint)((int)puVar30[1] == (int)puVar29[1]),
         iVar12 = -(uint)((int)((ulong)puVar30[1] >> 0x20) == (int)((ulong)puVar29[1] >> 0x20)),
         auVar67._4_4_ = iVar11, auVar67._0_4_ = iVar11, auVar67._8_4_ = iVar12,
         auVar67._12_4_ = iVar12, iVar11 = movmskpd((int)puVar30,auVar67), iVar11 != 3)) {
        __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1db,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar1 = *pfVar31;
      pfVar31 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
        __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1dc,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar32 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar31 != *pfVar32) || (NAN(*pfVar31) || NAN(*pfVar32))) ||
          (pfVar31[1] != pfVar32[1])) || (NAN(pfVar31[1]) || NAN(pfVar32[1]))) {
        __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1de,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pfVar31 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar1 = *pfVar31;
      pfVar31 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
        __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1df,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::lineOrder();
      iVar11 = *piVar21;
      piVar21 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar11 != *piVar21) {
        __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e0,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      piVar21 = (int *)Imf_3_2::Header::compression();
      iVar11 = *piVar21;
      piVar21 = (int *)Imf_3_2::Header::compression();
      if (iVar11 != *piVar21) {
        __assert_fail("in2.header ().compression () == hdr.compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e1,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      Imf_3_2::TiledInputFile::header();
      pCVar33 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar34 = (ChannelList *)Imf_3_2::Header::channels();
      cVar9 = Imf_3_2::ChannelList::operator==(pCVar33,pCVar34);
      if (cVar9 == '\0') {
        __assert_fail("in2.header ().channels () == hdr.channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                      ,0x1e2,
                      "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                     );
      }
      if (0 < (int)uVar15) {
        local_248 = 0;
        do {
          if (0 < (int)uVar48) {
            lVar52 = local_248 * lVar51;
            uVar44 = 0;
            do {
              lVar37 = 0;
              lVar49 = 0;
              while( true ) {
                iVar11 = Imf_3_2::TiledInputFile::levelHeight((int)&ph1);
                if (iVar11 <= lVar49) break;
                lVar53 = 0;
                while( true ) {
                  iVar11 = Imf_3_2::TiledInputFile::levelWidth((int)&ph1);
                  if (iVar11 <= lVar53) break;
                  fVar1 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)
                                            (__s_00[lVar52 * 3 + uVar44 * 3 + 1] * lVar37 +
                                             __s_00[lVar52 * 3 + uVar44 * 3 + 2] + lVar53 * 2) * 4);
                  pfVar31 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)
                                             (__s[lVar52 * 3 + uVar44 * 3 + 1] * lVar37 +
                                              __s[lVar52 * 3 + uVar44 * 3 + 2] + lVar53 * 2) * 4);
                  if ((fVar1 != *pfVar31) || (NAN(fVar1) || NAN(*pfVar31))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels1[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                                  ,0x1ea,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  if ((iVar16 - 8U < 0xfffffffe) &&
                     ((pfVar31 = (float *)(_imath_half_to_float_table +
                                          (ulong)*(uint16_t *)
                                                  ((long)&pAVar54[local_248 * lVar26 + uVar44]._data
                                                          [lVar53]._h +
                                                  pAVar54[local_248 * lVar26 + uVar44]._sizeY *
                                                  lVar37) * 4), fVar1 != *pfVar31 ||
                      (NAN(fVar1) || NAN(*pfVar31))))) {
                    __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCopyPixels.cpp"
                                  ,0x1ef,
                                  "void (anonymous namespace)::writeCopyReadRIP(const char *, const char *, int, int, int, int, int, int, Compression, LevelRoundingMode)"
                                 );
                  }
                  lVar53 = lVar53 + 1;
                }
                lVar49 = lVar49 + 1;
                lVar37 = lVar37 + 2;
              }
              uVar44 = uVar44 + 1;
            } while (uVar44 != uVar48);
          }
          local_248 = local_248 + 1;
        } while (local_248 != uVar35);
      }
      if (__s_00 != (ulong *)0x0) {
        uVar35 = *puVar39;
        if (uVar35 != 0) {
          lVar26 = uVar35 * 0x18;
          do {
            if (*(void **)((long)puVar39 + lVar26) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar39 + lVar26));
            }
            lVar26 = lVar26 + -0x18;
          } while (lVar26 != 0);
        }
        operator_delete__(puVar39,uVar35 * 0x18 + 8);
      }
      if (__s != (ulong *)0x0) {
        uVar35 = *puVar38;
        if (uVar35 != 0) {
          lVar26 = uVar35 * 0x18;
          do {
            if (*(void **)((long)puVar38 + lVar26) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar38 + lVar26));
            }
            lVar26 = lVar26 + -0x18;
          } while (lVar26 != 0);
        }
        operator_delete__(puVar38,uVar35 * 0x18 + 8);
      }
      Imf_3_2::TiledInputFile::~TiledInputFile(&in1);
      Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph1);
      remove(_Var8._M_p);
      remove(_Var7._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if (pAVar54 != (Array2D<Imath_3_2::half> *)0x0) {
        uVar35 = *puVar36;
        if (uVar35 != 0) {
          lVar26 = uVar35 * 0x18;
          do {
            if (*(void **)((long)puVar36 + lVar26) != (void *)0x0) {
              operator_delete__(*(void **)((long)puVar36 + lVar26));
            }
            lVar26 = lVar26 + -0x18;
          } while (lVar26 != 0);
        }
        operator_delete__(puVar36,uVar35 * 0x18 + 8);
      }
      Imf_3_2::Header::~Header(&hdr);
      bVar55 = iVar6 == 0;
      iVar6 = iVar6 + 1;
    } while (bVar55);
    iVar16 = iVar16 + 1;
    if (iVar16 == 10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename2._M_dataplus._M_p != &filename2.field_2) {
        operator_delete(filename2._M_dataplus._M_p,filename2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename1._M_dataplus._M_p != &filename1.field_2) {
        operator_delete(filename1._M_dataplus._M_p,filename1.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeCopyRead (
    const std::string& tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
        {
            writeCopyReadONE (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadMIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));

            writeCopyReadRIP (
                filename1.c_str (),
                filename2.c_str (),
                w,
                h,
                xs,
                ys,
                dx,
                dy,
                Compression (comp),
                LevelRoundingMode (rmode));
        }
    }
}